

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

double cs_impl::math_cs_ext::log(double __x)

{
  longdouble *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  double dVar1;
  
  logl();
  dVar1 = (double)logl();
  *(undefined1 *)(in_RDI + 1) = 0;
  *in_RDI = in_ST0 / in_ST1;
  return dVar1;
}

Assistant:

numeric log(const numeric& a, const numeric& b)
		{
			return std::log(b.as_float()) / std::log(a.as_float());
		}